

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coap.cpp
# Opt level: O2

void __thiscall
ot::commissioner::coap::Coap::RequestsCache::Eliminate
          (RequestsCache *this,RequestHolder *aRequestHolder)

{
  element_type *peVar1;
  const_iterator __position;
  
  __position._M_node = (this->mContainer)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  peVar1 = (aRequestHolder->mRequest).
           super___shared_ptr<ot::commissioner::coap::Message,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  do {
    if ((_Rb_tree_header *)__position._M_node ==
        &(this->mContainer)._M_t._M_impl.super__Rb_tree_header) {
LAB_001a0d65:
      UpdateTimer(this);
      return;
    }
    if (*(element_type **)(__position._M_node + 1) == peVar1) {
      std::
      _Rb_tree<ot::commissioner::coap::Coap::RequestHolder,ot::commissioner::coap::Coap::RequestHolder,std::_Identity<ot::commissioner::coap::Coap::RequestHolder>,std::less<ot::commissioner::coap::Coap::RequestHolder>,std::allocator<ot::commissioner::coap::Coap::RequestHolder>>
      ::erase_abi_cxx11_((_Rb_tree<ot::commissioner::coap::Coap::RequestHolder,ot::commissioner::coap::Coap::RequestHolder,std::_Identity<ot::commissioner::coap::Coap::RequestHolder>,std::less<ot::commissioner::coap::Coap::RequestHolder>,std::allocator<ot::commissioner::coap::Coap::RequestHolder>>
                          *)&this->mContainer,__position);
      goto LAB_001a0d65;
    }
    __position._M_node = (_Base_ptr)std::_Rb_tree_increment(__position._M_node);
  } while( true );
}

Assistant:

void Coap::RequestsCache::Eliminate(const RequestHolder &aRequestHolder)
{
    for (auto holder = mContainer.begin(); holder != mContainer.end(); ++holder)
    {
        if (holder->mRequest == aRequestHolder.mRequest)
        {
            mContainer.erase(holder);
            break;
        }
    }

    UpdateTimer();
}